

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

Shader LoadShader(char *vsFileName,char *fsFileName)

{
  char *vsCode;
  char *fsCode;
  Shader SVar1;
  
  if (vsFileName == (char *)0x0) {
    vsCode = (char *)0x0;
  }
  else {
    vsCode = LoadFileText(vsFileName);
  }
  if (fsFileName == (char *)0x0) {
    fsCode = (char *)0x0;
  }
  else {
    fsCode = LoadFileText(fsFileName);
  }
  SVar1 = LoadShaderFromMemory(vsCode,fsCode);
  UnloadFileText(vsCode);
  UnloadFileText(fsCode);
  SVar1._4_4_ = 0;
  return SVar1;
}

Assistant:

Shader LoadShader(const char *vsFileName, const char *fsFileName)
{
    Shader shader = { 0 };

    char *vShaderStr = NULL;
    char *fShaderStr = NULL;

    if (vsFileName != NULL) vShaderStr = LoadFileText(vsFileName);
    if (fsFileName != NULL) fShaderStr = LoadFileText(fsFileName);

    shader = LoadShaderFromMemory(vShaderStr, fShaderStr);

    UnloadFileText(vShaderStr);
    UnloadFileText(fShaderStr);

    return shader;
}